

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>>
               (char *label_id,GetterXsYs<unsigned_char> *getter1,GetterXsYs<unsigned_char> *getter2
               )

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int iVar3;
  ImU32 col;
  long lVar4;
  ImDrawList *DrawList;
  int iVar5;
  int iVar6;
  int iVar7;
  ImPlotPoint p2;
  ImPlotPoint p1;
  ImPlotPoint local_70;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar2 = BeginItem(label_id,1);
  if (bVar2) {
    if (GImPlot->FitThisFrame == true) {
      iVar7 = getter1->Count;
      iVar5 = getter2->Count;
      iVar6 = iVar5;
      if (iVar7 < iVar5) {
        iVar6 = iVar7;
      }
      if (0 < iVar6) {
        iVar6 = 0;
        do {
          lVar4 = (long)(((getter1->Offset + iVar6) % iVar7 + iVar7) % iVar7) *
                  (long)getter1->Stride;
          local_60.Getter1 = (GetterXsYs<unsigned_char> *)(double)getter1->Xs[lVar4];
          local_60.Getter2 = (GetterXsYs<unsigned_char> *)(double)getter1->Ys[lVar4];
          lVar4 = (long)(((getter2->Offset + iVar6) % iVar5 + iVar5) % iVar5) *
                  (long)getter2->Stride;
          local_70.x = (double)getter2->Xs[lVar4];
          local_70.y = (double)getter2->Ys[lVar4];
          FitPoint((ImPlotPoint *)&local_60);
          FitPoint(&local_70);
          iVar6 = iVar6 + 1;
          iVar7 = getter1->Count;
          iVar5 = getter2->Count;
          iVar3 = iVar5;
          if (iVar7 < iVar5) {
            iVar3 = iVar7;
          }
        } while (iVar6 < iVar3);
      }
    }
    pIVar1 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar1->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 1);
      iVar7 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar7]) {
      case 0:
        local_70.x = (double)CONCAT44(local_70.x._4_4_,iVar7);
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,getter1,getter2,(TransformerLinLin *)&local_70,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_70.x = (double)CONCAT44(local_70.x._4_4_,iVar7);
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
                          *)&local_60,getter1,getter2,(TransformerLogLin *)&local_70,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_70.x = (double)CONCAT44(local_70.x._4_4_,iVar7);
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
                          *)&local_60,getter1,getter2,(TransformerLinLog *)&local_70,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_70.x = (double)CONCAT44(local_70.x._4_4_,iVar7);
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
                          *)&local_60,getter1,getter2,(TransformerLogLog *)&local_70,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYs<unsigned_char>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_char>,_ImPlot::GetterXsYs<unsigned_char>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar1 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar1->NextItemData);
    pIVar1->PreviousItem = pIVar1->CurrentItem;
    pIVar1->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < ImMin(getter1.Count, getter2.Count); ++i) {
                ImPlotPoint p1 = getter1(i);
                ImPlotPoint p2 = getter2(i);
                FitPoint(p1);
                FitPoint(p2);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}